

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O0

spv_result_t
spvOperandTableNameLookup
          (spv_target_env param_1,spv_operand_table table,spv_operand_type_t type,char *name,
          size_t nameLength,spv_operand_desc *pEntry)

{
  char *__s;
  int iVar1;
  spv_operand_desc_group_t *psVar2;
  spv_operand_desc_t *psVar3;
  size_t sVar4;
  size_t aliasLength;
  char *alias;
  uint32_t aliasIndex;
  spv_operand_desc_t *entry;
  uint64_t index;
  spv_operand_desc_group_t *group;
  uint64_t typeIndex;
  spv_operand_desc *pEntry_local;
  size_t nameLength_local;
  char *name_local;
  spv_operand_type_t type_local;
  spv_operand_table table_local;
  spv_target_env param_0_local;
  
  if (table == (spv_operand_table)0x0) {
    table_local._4_4_ = SPV_ERROR_INVALID_TABLE;
  }
  else if ((name == (char *)0x0) || (pEntry == (spv_operand_desc *)0x0)) {
    table_local._4_4_ = SPV_ERROR_INVALID_POINTER;
  }
  else {
    for (group = (spv_operand_desc_group_t *)0x0;
        group < (spv_operand_desc_group_t *)(ulong)table->count;
        group = (spv_operand_desc_group_t *)((long)&group->type + 1)) {
      psVar2 = table->types + (long)group;
      if (type == psVar2->type) {
        for (entry = (spv_operand_desc_t *)0x0; entry < (spv_operand_desc_t *)(ulong)psVar2->count;
            entry = (spv_operand_desc_t *)((long)&entry->name + 1)) {
          psVar3 = psVar2->entries + (long)entry;
          sVar4 = strlen(psVar3->name);
          if ((nameLength == sVar4) && (iVar1 = strncmp(psVar3->name,name,nameLength), iVar1 == 0))
          {
            *pEntry = psVar3;
            return SPV_SUCCESS;
          }
          if (psVar3->numAliases != 0) {
            for (alias._4_4_ = 0; alias._4_4_ < psVar3->numAliases; alias._4_4_ = alias._4_4_ + 1) {
              __s = psVar3->aliases[alias._4_4_];
              sVar4 = strlen(__s);
              if ((nameLength == sVar4) && (iVar1 = strncmp(name,__s,nameLength), iVar1 == 0)) {
                *pEntry = psVar3;
                return SPV_SUCCESS;
              }
            }
          }
        }
      }
    }
    table_local._4_4_ = SPV_ERROR_INVALID_LOOKUP;
  }
  return table_local._4_4_;
}

Assistant:

spv_result_t spvOperandTableNameLookup(spv_target_env,
                                       const spv_operand_table table,
                                       const spv_operand_type_t type,
                                       const char* name,
                                       const size_t nameLength,
                                       spv_operand_desc* pEntry) {
  if (!table) return SPV_ERROR_INVALID_TABLE;
  if (!name || !pEntry) return SPV_ERROR_INVALID_POINTER;

  for (uint64_t typeIndex = 0; typeIndex < table->count; ++typeIndex) {
    const auto& group = table->types[typeIndex];
    if (type != group.type) continue;
    for (uint64_t index = 0; index < group.count; ++index) {
      const auto& entry = group.entries[index];
      // We consider the current operand as available as long as
      // it is in the grammar.  It might not be *valid* to use,
      // but that should be checked by the validator, not by parsing.
      //
      // Exact match case
      if (nameLength == strlen(entry.name) &&
          !strncmp(entry.name, name, nameLength)) {
        *pEntry = &entry;
        return SPV_SUCCESS;
      }

      // Check the aliases. Ideally we would have a version of the table sorted
      // by name and then we could iterate between the lower and upper bounds to
      // restrict the amount comparisons. Fortunately, name-based lookups are
      // mostly restricted to the assembler.
      if (entry.numAliases > 0) {
        for (uint32_t aliasIndex = 0; aliasIndex < entry.numAliases;
             aliasIndex++) {
          const auto alias = entry.aliases[aliasIndex];
          const size_t aliasLength = strlen(alias);
          if (nameLength == aliasLength && !strncmp(name, alias, nameLength)) {
            *pEntry = &entry;
            return SPV_SUCCESS;
          }
        }
      }
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}